

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  sel_t sVar13;
  ulong uVar14;
  bool bVar15;
  
  if (count + 0x3f < 0x40) {
    iVar6 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    lVar8 = 0;
    uVar7 = 0;
    uVar11 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = 0xffffffffffffffff;
      }
      else {
        uVar12 = puVar1[uVar7];
      }
      uVar10 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar10 = count;
      }
      uVar9 = uVar11;
      if (uVar12 == 0xffffffffffffffff) {
        if (uVar11 < uVar10) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar14 = uVar11 << 4 | 8;
          do {
            uVar9 = uVar11;
            if (psVar2 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar2[uVar11];
            }
            bVar15 = *(long *)((long)&ldata->lower + uVar14) ==
                     *(long *)((long)&rdata->lower + uVar14);
            bVar5 = *(long *)((long)ldata + (uVar14 - 8)) == *(long *)((long)rdata + (uVar14 - 8));
            psVar3[iVar6] = (sel_t)uVar9;
            iVar6 = iVar6 + (bVar15 && bVar5);
            psVar4[lVar8] = (sel_t)uVar9;
            lVar8 = lVar8 + (ulong)(!bVar15 || !bVar5);
            uVar11 = uVar11 + 1;
            uVar14 = uVar14 + 0x10;
            uVar9 = uVar11;
          } while (uVar10 != uVar11);
        }
      }
      else if (uVar12 == 0) {
        uVar9 = uVar10;
        if (uVar11 < uVar10) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar13 = (sel_t)uVar11;
            if (psVar2 != (sel_t *)0x0) {
              sVar13 = psVar2[uVar11];
            }
            psVar3[lVar8] = sVar13;
            lVar8 = lVar8 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
      }
      else if (uVar11 < uVar10) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        uVar14 = uVar11 << 4 | 8;
        uVar9 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar13 = (int)uVar11 + (int)uVar9;
          }
          else {
            sVar13 = psVar2[uVar11 + uVar9];
          }
          if ((uVar12 >> (uVar9 & 0x3f) & 1) == 0) {
            bVar15 = false;
          }
          else {
            bVar15 = *(long *)((long)&ldata->lower + uVar14) ==
                     *(long *)((long)&rdata->lower + uVar14) &&
                     *(long *)((long)ldata + (uVar14 - 8)) == *(long *)((long)rdata + (uVar14 - 8));
          }
          psVar3[iVar6] = sVar13;
          iVar6 = iVar6 + bVar15;
          psVar4[lVar8] = sVar13;
          lVar8 = lVar8 + (ulong)(bVar15 ^ 1);
          uVar9 = uVar9 + 1;
          uVar14 = uVar14 + 0x10;
        } while ((uVar11 - uVar10) + uVar9 != 0);
        uVar9 = uVar11 + uVar9;
      }
      uVar7 = uVar7 + 1;
      uVar11 = uVar9;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}